

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void __thiscall
glslang::TBuiltIns::addSamplingFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  char *__s;
  byte bVar12;
  uint uVar13;
  byte bVar14;
  byte bVar15;
  int sparse;
  int iVar16;
  char *__s_00;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  char *pcVar23;
  char *__s_01;
  uint uVar24;
  int iVar25;
  bool bVar26;
  bool bVar27;
  long lStack_180;
  short local_164;
  int local_15c;
  char local_138;
  TString s;
  
  uVar19 = (uint)sampler & 0xff00;
  bVar26 = ((uint)sampler & 0x140000) == 0x100000;
  bVar14 = (byte)((uint)sampler >> 0x14);
  uVar13 = (uint)sampler & 0x20000;
  bVar15 = (byte)(uVar13 >> 0x11);
  uVar21 = (uint)sampler >> 8 & 0xff;
  uVar24 = (uint)sampler & 0xff;
  pcVar11 = "float ";
  if (uVar24 == 3) {
    pcVar11 = "float16_t ";
  }
  pcVar2 = ", float";
  if (uVar24 == 3) {
    pcVar2 = ", float16_t";
  }
  iVar5 = 0;
  do {
    if (iVar5 == 2) {
      return;
    }
    iVar25 = 0;
    if (iVar5 == 0) {
      bVar3 = false;
LAB_003f3c02:
      for (; iVar25 != 2; iVar25 = iVar25 + 1) {
        local_164 = (short)uVar19;
        bVar1 = bVar26;
        if (iVar25 == 0) {
LAB_003f3c78:
          for (iVar18 = 0; iVar18 != 2; iVar18 = iVar18 + 1) {
            if ((iVar18 == 0) ||
               ((bVar1 && ((((local_138 = sampler._1_1_, local_138 != '\x04' &&
                             (local_138 != '\x02')) || (((uint)sampler & 0x30000) != 0x30000)) &&
                           ((local_164 != 0x500 && (uVar19 != 0x600)))))))) {
              for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
                if (((uint)(iVar18 + iVar25 + iVar6 + iVar5) < 4) &&
                   ((iVar6 == 0 ||
                    (((uVar19 | 0x200) != 0x600 && (((uint)sampler >> 0x12 & 1) == 0)))))) {
                  for (iVar20 = 0; iVar20 != 2; iVar20 = iVar20 + 1) {
                    uVar7 = iVar6 + iVar5 + iVar20 + iVar18 + iVar25;
                    if ((uVar7 < 4) && (iVar18 == 0 && iVar25 == 0 || iVar20 == 0)) {
                      if (iVar20 == 0) {
                        if ((((uint)sampler >> 0x12 & 1) == 0 & bVar14 & uVar19 != 0x600) != 0)
                        goto LAB_003f3dba;
                      }
                      else if (uVar19 != 0x400 && bVar15 == 0) {
LAB_003f3dba:
                        bVar27 = iVar20 != 0;
                        pcVar23 = "sparseTexture";
                        if (bVar27) {
                          pcVar23 = "sparseTexel";
                        }
                        __s_01 = "texture";
                        if (bVar27) {
                          __s_01 = "texel";
                        }
                        for (iVar22 = 0; iVar22 != 2; iVar22 = iVar22 + 1) {
                          if (((iVar18 == 0 && iVar25 == 0) && (uVar19 != 0x600 && bVar26) ||
                               iVar22 == 0) && (uVar7 + iVar22 < 4)) {
                            for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
                              iVar10 = this->dimMap[uVar21] + ((uint)sampler >> 0x10 & 1);
                              iVar9 = 2;
                              if (2 < iVar10) {
                                iVar9 = iVar10;
                              }
                              if (uVar13 == 0) {
                                iVar9 = iVar10;
                              }
                              iVar9 = iVar9 + (uVar13 >> 0x11) + iVar5;
                              local_15c = 4;
                              if (uVar13 == 0) {
                                local_15c = iVar9;
                              }
                              if (iVar9 < 5) {
                                local_15c = iVar9;
                              }
                              if (4 < local_15c) {
                                __assert_fail("totalDims <= 4",
                                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Initialize.cpp"
                                              ,0x1c68,
                                              "void glslang::TBuiltIns::addSamplingFunctions(TSampler, const TString &, int, EProfile)"
                                             );
                              }
                              if (iVar8 == 0 || (bVar14 & 1 & bVar3) != 0) {
                                bVar4 = 4 < iVar9 & bVar15;
                                for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
                                  if (iVar9 == 0) {
                                    lStack_180 = 1;
LAB_003f3f1d:
                                    if (iVar20 != 0) {
                                      lStack_180 = 8;
                                    }
                                    __s_00 = ",float16_t";
                                    if (iVar9 == 0) {
                                      __s_00 = ",float";
                                    }
                                    __s = ",f16vec";
                                    if (iVar9 == 0) {
                                      __s = ",vec";
                                    }
                                    for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
                                      if (((iVar25 == 0 && iVar5 == 0) && iVar20 == 0) &&
                                          (0x1c1 < version && profile != EEsProfile) || iVar10 == 0)
                                      {
                                        for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
                                          if (iVar16 == 0) {
                                            s._M_dataplus.super_allocator_type.allocator =
                                                 GetThreadPoolAllocator();
                                            s._M_string_length = 0;
                                            s._M_dataplus._M_p = (pointer)&s.field_2;
                                            s.field_2._M_local_buf[0] = '\0';
                                            pcVar17 = pcVar11;
                                            if (uVar13 == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,this->prefixes[uVar24]);
                                              pcVar17 = "vec4 ";
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,pcVar17);
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,__s_01);
                                            pcVar17 = "Proj";
                                            if (iVar5 != 0) goto LAB_003f40a7;
LAB_003f40af:
                                            if (iVar25 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,"Lod");
                                            }
                                            if (iVar22 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,"Grad");
                                            }
                                            if (iVar20 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,"Fetch");
                                            }
                                            if (iVar6 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,"Offset");
                                            }
                                            if (iVar10 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,"Clamp");
                                            }
                                            if (iVar16 != 0 || iVar10 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,"ARB");
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,"(");
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,typeName);
                                            if (iVar8 == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,",");
                                              if (local_15c == 1) {
                                                pcVar17 = TType::getBasicString
                                                                    ((TBasicType)lStack_180);
                                              }
                                              else {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,this->prefixes[lStack_180]);
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,"vec");
                                                pcVar17 = this->postfixes[local_15c];
                                              }
                                            }
                                            else if (iVar9 == 0) {
                                              pcVar17 = ",vec4";
                                            }
                                            else {
                                              pcVar17 = ",f16vec4";
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,pcVar17);
                                            if (bVar4 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,",float");
                                            }
                                            if ((iVar20 != 0) &&
                                               (((local_164 != 0x600 && (uVar19 != 0x500)) ||
                                                (((byte)((uint)sampler >> 0x12) & bVar27) != 0)))) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,",int");
                                            }
                                            if (iVar25 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,__s_00);
                                            }
                                            if (iVar22 != 0) {
                                              if (this->dimMap[uVar21] == 1) {
                                                if (iVar9 == 0) {
                                                  pcVar17 = ",float,float";
                                                }
                                                else {
                                                  pcVar17 = ",float16_t,float16_t";
                                                }
                                              }
                                              else {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,__s);
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,this->postfixes[this->dimMap[uVar21]]);
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,__s);
                                                pcVar17 = this->postfixes[this->dimMap[uVar21]];
                                              }
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,pcVar17);
                                            }
                                            if (iVar6 != 0) {
                                              if (this->dimMap[uVar21] == 1) {
                                                pcVar17 = ",int";
                                              }
                                              else {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,",ivec");
                                                pcVar17 = this->postfixes[this->dimMap[uVar21]];
                                              }
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,pcVar17);
                                            }
                                            if (iVar10 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,__s_00);
                                            }
                                            if (iVar16 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,",out ");
                                              pcVar17 = pcVar2 + 2;
                                              if (uVar13 == 0) {
                                                std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::append(&s,this->prefixes[uVar24]);
                                                pcVar17 = "vec4";
                                              }
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,pcVar17);
                                            }
                                            if (iVar18 != 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&s,__s_00);
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,");\n");
                                            this_00 = &(this->super_TBuiltInParseables).
                                                       commonBuiltins;
                                            if ((iVar10 != 0 || iVar18 != 0) && iVar22 == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append((this->super_TBuiltInParseables).
                                                       stageBuiltins + 4,&s);
                                              this_00 = (this->super_TBuiltInParseables).
                                                        stageBuiltins + 5;
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(this_00,&s);
                                          }
                                          else if (((iVar5 == 0 &&
                                                     (0x1c1 < version && profile != EEsProfile)) &&
                                                   (local_164 != 0x100)) && (uVar19 != 0x600)) {
                                            s._M_dataplus.super_allocator_type.allocator =
                                                 GetThreadPoolAllocator();
                                            s._M_dataplus._M_p = (pointer)&s.field_2;
                                            s._M_string_length = 0;
                                            s.field_2._M_local_buf[0] = '\0';
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,"int ");
                                            pcVar17 = pcVar23;
LAB_003f40a7:
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&s,pcVar17);
                                            goto LAB_003f40af;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  else if (uVar24 == 3) {
                                    if (uVar13 != 0) {
                                      bVar12 = bVar4;
                                      if (bVar4 == 0) {
                                        bVar12 = 1;
                                      }
                                      local_15c = local_15c - ((byte)~bVar4 & 1);
                                      bVar4 = bVar12;
                                    }
                                    lStack_180 = 3;
                                    goto LAB_003f3f1d;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else if (((local_164 != 0x500) && (uVar19 != 0x600)) &&
                ((((uint)sampler & 0x2ff00) != 0x20400 && ((uint)sampler & 0x3ff00) != 0x30200) &&
                 bVar26)) {
          bVar1 = false;
          goto LAB_003f3c78;
        }
      }
    }
    else if (((uVar19 | 0x200) != 0x600) &&
            (bVar3 = uVar19 != 0x300 && uVar13 == 0, ((uint)sampler & 0x150000) == 0x100000))
    goto LAB_003f3c02;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void TBuiltIns::addSamplingFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // texturing
    //
    for (int proj = 0; proj <= 1; ++proj) { // loop over "bool" projective or not

        if (proj && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.arrayed || sampler.isMultiSample()
            || !sampler.isCombined()))
            continue;

        for (int lod = 0; lod <= 1; ++lod) {

            if (lod && (sampler.isBuffer() || sampler.isRect() || sampler.isMultiSample() || !sampler.isCombined()))
                continue;
            if (lod && sampler.dim == Esd2D && sampler.arrayed && sampler.shadow)
                continue;
            if (lod && sampler.dim == EsdCube && sampler.shadow)
                continue;

            for (int bias = 0; bias <= 1; ++bias) {

                if (bias && (lod || sampler.isMultiSample() || !sampler.isCombined()))
                    continue;
                if (bias && (sampler.dim == Esd2D || sampler.dim == EsdCube) && sampler.shadow && sampler.arrayed)
                    continue;
                if (bias && (sampler.isRect() || sampler.isBuffer()))
                    continue;

                for (int offset = 0; offset <= 1; ++offset) { // loop over "bool" offset or not

                    if (proj + offset + bias + lod > 3)
                        continue;
                    if (offset && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.isMultiSample()))
                        continue;

                    for (int fetch = 0; fetch <= 1; ++fetch) { // loop over "bool" fetch or not

                        if (proj + offset + fetch + bias + lod > 3)
                            continue;
                        if (fetch && (lod || bias))
                            continue;
                        if (fetch && (sampler.shadow || sampler.dim == EsdCube))
                            continue;
                        if (fetch == 0 && (sampler.isMultiSample() || sampler.isBuffer()
                            || !sampler.isCombined()))
                            continue;

                        for (int grad = 0; grad <= 1; ++grad) { // loop over "bool" grad or not

                            if (grad && (lod || bias || sampler.isMultiSample() || !sampler.isCombined()))
                                continue;
                            if (grad && sampler.isBuffer())
                                continue;
                            if (proj + offset + fetch + grad + bias + lod > 3)
                                continue;

                            for (int extraProj = 0; extraProj <= 1; ++extraProj) {
                                bool compare = false;
                                int totalDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0);
                                // skip dummy unused second component for 1D non-array shadows
                                if (sampler.shadow && totalDims < 2)
                                    totalDims = 2;
                                totalDims += (sampler.shadow ? 1 : 0) + proj;
                                if (totalDims > 4 && sampler.shadow) {
                                    compare = true;
                                    totalDims = 4;
                                }
                                assert(totalDims <= 4);

                                if (extraProj && ! proj)
                                    continue;
                                if (extraProj && (sampler.dim == Esd3D || sampler.shadow || !sampler.isCombined()))
                                    continue;

                                // loop over 16-bit floating-point texel addressing
                                for (int f16TexAddr = 0; f16TexAddr <= 1; ++f16TexAddr)
                                {
                                    if (f16TexAddr && sampler.type != EbtFloat16)
                                        continue;
                                    if (f16TexAddr && sampler.shadow && ! compare) {
                                        compare = true; // compare argument is always present
                                        totalDims--;
                                    }
                                    // loop over "bool" lod clamp
                                    for (int lodClamp = 0; lodClamp <= 1 ;++lodClamp)
                                    {
                                        if (lodClamp && (profile == EEsProfile || version < 450))
                                            continue;
                                        if (lodClamp && (proj || lod || fetch))
                                            continue;

                                        // loop over "bool" sparse or not
                                        for (int sparse = 0; sparse <= 1; ++sparse)
                                        {
                                            if (sparse && (profile == EEsProfile || version < 450))
                                                continue;
                                            // Sparse sampling is not for 1D/1D array texture, buffer texture, and
                                            // projective texture
                                            if (sparse && (sampler.is1D() || sampler.isBuffer() || proj))
                                                continue;

                                            TString s;

                                            // return type
                                            if (sparse)
                                                s.append("int ");
                                            else {
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t ");
                                                    else
                                                        s.append("float ");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4 ");
                                                }
                                            }

                                            // name
                                            if (sparse) {
                                                if (fetch)
                                                    s.append("sparseTexel");
                                                else
                                                    s.append("sparseTexture");
                                            }
                                            else {
                                                if (fetch)
                                                    s.append("texel");
                                                else
                                                    s.append("texture");
                                            }
                                            if (proj)
                                                s.append("Proj");
                                            if (lod)
                                                s.append("Lod");
                                            if (grad)
                                                s.append("Grad");
                                            if (fetch)
                                                s.append("Fetch");
                                            if (offset)
                                                s.append("Offset");
                                            if (lodClamp)
                                                s.append("Clamp");
                                            if (lodClamp != 0 || sparse)
                                                s.append("ARB");
                                            s.append("(");

                                            // sampler type
                                            s.append(typeName);
                                            // P coordinate
                                            if (extraProj) {
                                                if (f16TexAddr)
                                                    s.append(",f16vec4");
                                                else
                                                    s.append(",vec4");
                                            } else {
                                                s.append(",");
                                                TBasicType t = fetch ? EbtInt : (f16TexAddr ? EbtFloat16 : EbtFloat);
                                                if (totalDims == 1)
                                                    s.append(TType::getBasicString(t));
                                                else {
                                                    s.append(prefixes[t]);
                                                    s.append("vec");
                                                    s.append(postfixes[totalDims]);
                                                }
                                            }
                                            // non-optional compare
                                            if (compare)
                                                s.append(",float");

                                            // non-optional lod argument (lod that's not driven by lod loop) or sample
                                            if ((fetch && !sampler.isBuffer() &&
                                                 !sampler.isRect() && !sampler.isMultiSample())
                                                 || (sampler.isMultiSample() && fetch))
                                                s.append(",int");
                                            // non-optional lod
                                            if (lod) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }

                                            // gradient arguments
                                            if (grad) {
                                                if (dimMap[sampler.dim] == 1) {
                                                    if (f16TexAddr)
                                                        s.append(",float16_t,float16_t");
                                                    else
                                                        s.append(",float,float");
                                                } else {
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }
                                            // offset
                                            if (offset) {
                                                if (dimMap[sampler.dim] == 1)
                                                    s.append(",int");
                                                else {
                                                    s.append(",ivec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }

                                            // lod clamp
                                            if (lodClamp) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            // texel out (for sparse texture)
                                            if (sparse) {
                                                s.append(",out ");
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t");
                                                    else
                                                        s.append("float");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4");
                                                }
                                            }
                                            // optional bias
                                            if (bias) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            s.append(");\n");

                                            // Add to the per-language set of built-ins
                                            if (!grad && (bias || lodClamp != 0)) {
                                                stageBuiltins[EShLangFragment].append(s);
                                                stageBuiltins[EShLangCompute].append(s);
                                            } else
                                                commonBuiltins.append(s);

                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}